

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS
ref_metric_belme_gu(REF_DBL *metric,REF_GRID ref_grid,REF_INT ldim,REF_DBL *prim_dual,REF_DBL mach,
                   REF_DBL re,REF_DBL reference_temp,REF_RECON_RECONSTRUCTION reconstruction)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  void *pvVar5;
  uint uVar6;
  REF_STATUS RVar7;
  uint uVar8;
  REF_DBL *scalar;
  ulong uVar9;
  REF_DBL *pRVar10;
  double *pdVar11;
  REF_DBL *pRVar12;
  ulong uVar13;
  REF_DBL *pRVar14;
  ulong uVar15;
  undefined8 uVar16;
  long lVar17;
  REF_NODE pRVar18;
  char *pcVar19;
  double *pdVar20;
  long lVar21;
  undefined1 auVar22 [16];
  REF_DBL RVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  double dVar27;
  REF_DBL mu;
  REF_RECON_RECONSTRUCTION local_164;
  REF_NODE local_160;
  uint local_154;
  REF_DBL *local_150;
  REF_DBL *local_148;
  REF_DBL *local_140;
  long local_138;
  double local_130;
  REF_DBL *local_128;
  REF_GRID local_120;
  REF_DBL mu_t;
  double *local_110;
  double local_108;
  void *local_100;
  double *local_f8;
  undefined8 uStack_f0;
  long local_e8;
  REF_DBL local_e0;
  REF_DBL local_d8;
  double local_d0;
  REF_DBL *local_c8;
  REF_DBL *local_c0;
  double local_b8;
  undefined8 uStack_b0;
  REF_DBL *local_a8;
  REF_DBL local_a0;
  REF_DBL diag_system [12];
  
  uVar6 = ref_grid->node->max;
  uVar15 = (ulong)uVar6;
  if ((int)uVar6 < 0) {
    pcVar19 = "malloc lam of REF_DBL negative";
    uVar16 = 0xacc;
LAB_001b4ee9:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar16
           ,"ref_metric_belme_gu",pcVar19);
    RVar7 = 1;
  }
  else {
    local_138 = CONCAT44(local_138._4_4_,ldim / 2);
    local_164 = reconstruction;
    local_160 = ref_grid->node;
    local_120 = ref_grid;
    local_e0 = mach;
    local_d8 = reference_temp;
    local_a0 = re;
    scalar = (REF_DBL *)malloc(uVar15 * 8);
    if (scalar == (REF_DBL *)0x0) {
      pcVar19 = "malloc lam of REF_DBL NULL";
      uVar16 = 0xacc;
    }
    else {
      for (uVar9 = 0; uVar15 != uVar9; uVar9 = uVar9 + 1) {
        scalar[uVar9] = 0.0;
      }
      local_f8 = (double *)(uVar15 * 0x30);
      local_128 = metric;
      pRVar10 = (REF_DBL *)malloc((size_t)local_f8);
      if (pRVar10 == (REF_DBL *)0x0) {
        pcVar19 = "malloc hess_lam of REF_DBL NULL";
        uVar16 = 0xacd;
      }
      else {
        for (uVar9 = 0; uVar6 * 6 != uVar9; uVar9 = uVar9 + 1) {
          pRVar10[uVar9] = 0.0;
        }
        local_148 = (REF_DBL *)(uVar15 * 0x18);
        local_154 = ldim;
        local_a8 = pRVar10;
        pRVar10 = (REF_DBL *)malloc((size_t)local_148);
        if (pRVar10 == (REF_DBL *)0x0) {
          pcVar19 = "malloc grad_lam of REF_DBL NULL";
          uVar16 = 0xace;
        }
        else {
          uVar13 = uVar15 * 3 & 0xffffffff;
          for (uVar9 = 0; uVar13 != uVar9; uVar9 = uVar9 + 1) {
            pRVar10[uVar9] = 0.0;
          }
          local_c0 = pRVar10;
          pdVar11 = (double *)malloc(uVar15 * 0x28);
          if (pdVar11 == (double *)0x0) {
            pcVar19 = "malloc sr_lam of REF_DBL NULL";
            uVar16 = 0xacf;
          }
          else {
            for (uVar9 = 0; (uVar15 * 5 & 0xffffffff) != uVar9; uVar9 = uVar9 + 1) {
              pdVar11[uVar9] = 0.0;
            }
            local_110 = pdVar11;
            pRVar10 = (REF_DBL *)malloc(uVar15 * 8);
            if (pRVar10 == (REF_DBL *)0x0) {
              pcVar19 = "malloc u of REF_DBL NULL";
              uVar16 = 0xad0;
            }
            else {
              for (uVar9 = 0; uVar15 != uVar9; uVar9 = uVar9 + 1) {
                pRVar10[uVar9] = 0.0;
              }
              local_140 = pRVar10;
              pRVar10 = (REF_DBL *)malloc((size_t)local_f8);
              if (pRVar10 == (REF_DBL *)0x0) {
                pcVar19 = "malloc hess_u of REF_DBL NULL";
                uVar16 = 0xad1;
              }
              else {
                for (uVar9 = 0; uVar6 * 6 != uVar9; uVar9 = uVar9 + 1) {
                  pRVar10[uVar9] = 0.0;
                }
                local_150 = pRVar10;
                pRVar10 = (REF_DBL *)malloc((size_t)local_148);
                if (pRVar10 == (REF_DBL *)0x0) {
                  pcVar19 = "malloc grad_u of REF_DBL NULL";
                  uVar16 = 0xad2;
                }
                else {
                  for (uVar9 = 0; uVar13 != uVar9; uVar9 = uVar9 + 1) {
                    pRVar10[uVar9] = 0.0;
                  }
                  local_c8 = pRVar10;
                  local_100 = malloc(uVar15 * 0x48);
                  if (local_100 != (void *)0x0) {
                    for (uVar9 = 0; (uVar15 * 9 & 0xffffffff) != uVar9; uVar9 = uVar9 + 1) {
                      *(undefined8 *)((long)local_100 + uVar9 * 8) = 0;
                    }
                    local_e8 = (long)(int)local_154;
                    local_130 = (double)(long)(int)local_138;
                    pRVar10 = prim_dual + (long)local_130;
                    local_138 = local_e8 * 8;
                    lVar17 = 0;
                    local_f8 = local_110;
                    pRVar18 = local_160;
                    while( true ) {
                      pRVar14 = local_a8;
                      pvVar5 = local_100;
                      uVar9 = 0;
                      if (0 < (int)uVar15) {
                        uVar9 = uVar15 & 0xffffffff;
                      }
                      if (lVar17 == 5) break;
                      pRVar12 = pRVar10;
                      for (uVar15 = 0; uVar9 != uVar15; uVar15 = uVar15 + 1) {
                        if (-1 < pRVar18->global[uVar15]) {
                          scalar[uVar15] = *pRVar12;
                        }
                        pRVar12 = (REF_DBL *)((long)pRVar12 + local_138);
                      }
                      uVar6 = ref_recon_hessian(local_120,scalar,local_a8,local_164);
                      if (uVar6 != 0) {
                        uVar15 = (ulong)uVar6;
                        pcVar19 = "hess_lam";
                        uVar16 = 0xad9;
LAB_001b52de:
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                               ,uVar16,"ref_metric_belme_gu",uVar15,pcVar19);
                        return (REF_STATUS)uVar15;
                      }
                      pRVar18 = local_160;
                      pdVar11 = local_f8;
                      local_148 = pRVar10;
                      for (lVar21 = 0; uVar15 = (ulong)pRVar18->max, lVar21 < (long)uVar15;
                          lVar21 = lVar21 + 1) {
                        if (-1 < pRVar18->global[lVar21]) {
                          uVar6 = ref_matrix_diag_m(pRVar14,diag_system);
                          if (uVar6 != 0) {
                            uVar15 = (ulong)uVar6;
                            pcVar19 = "decomp";
                            uVar16 = 0xadb;
                            goto LAB_001b52de;
                          }
                          auVar1._8_8_ = (ulong)diag_system[1] ^ DAT_001f5020._8_8_;
                          auVar1._0_8_ = (ulong)diag_system[0] ^ (ulong)DAT_001f5020;
                          auVar22 = maxpd(diag_system._0_16_,auVar1);
                          dVar25 = auVar22._0_8_;
                          if (auVar22._0_8_ <= auVar22._8_8_) {
                            dVar25 = auVar22._8_8_;
                          }
                          dVar24 = (double)((ulong)diag_system[2] ^ (ulong)DAT_001f5020);
                          RVar23 = diag_system[2];
                          if (diag_system[2] <= dVar24) {
                            RVar23 = dVar24;
                          }
                          if (dVar25 <= RVar23) {
                            dVar25 = RVar23;
                          }
                          *pdVar11 = dVar25;
                          pRVar18 = local_160;
                        }
                        pdVar11 = pdVar11 + 5;
                        pRVar14 = pRVar14 + 6;
                      }
                      lVar17 = lVar17 + 1;
                      pRVar10 = local_148 + 1;
                      local_f8 = local_f8 + 1;
                    }
                    pRVar10 = prim_dual + (long)local_130 + 4;
                    uVar13 = 0;
                    uVar9 = uVar15 & 0xffffffff;
                    if ((int)uVar15 < 1) {
                      uVar9 = uVar13;
                    }
                    for (; uVar9 != uVar13; uVar13 = uVar13 + 1) {
                      if (-1 < pRVar18->global[uVar13]) {
                        scalar[uVar13] = *pRVar10;
                      }
                      pRVar10 = (REF_DBL *)((long)pRVar10 + local_138);
                    }
                    uVar6 = ref_recon_gradient(local_120,scalar,local_c0,local_164);
                    if (uVar6 != 0) {
                      uVar15 = (ulong)uVar6;
                      pcVar19 = "grad_u";
                      uVar16 = 0xae6;
                      goto LAB_001b52de;
                    }
                    pdVar11 = (double *)((long)pvVar5 + 0x10);
                    lVar17 = 0;
                    pRVar10 = prim_dual;
                    while (pRVar10 = pRVar10 + 1, lVar17 != 3) {
                      lVar17 = lVar17 + 1;
                      uVar15 = (ulong)(uint)local_160->max;
                      if (local_160->max < 1) {
                        uVar15 = 0;
                      }
                      pRVar14 = pRVar10;
                      for (uVar9 = 0; uVar15 != uVar9; uVar9 = uVar9 + 1) {
                        if (-1 < local_160->global[uVar9]) {
                          local_140[uVar9] = *pRVar14;
                        }
                        pRVar14 = (REF_DBL *)((long)pRVar14 + local_138);
                      }
                      uVar6 = ref_recon_gradient(local_120,local_140,local_c8,local_164);
                      if (uVar6 != 0) {
                        uVar15 = (ulong)uVar6;
                        pcVar19 = "grad_u";
                        uVar16 = 0xaed;
                        goto LAB_001b52de;
                      }
                      uVar15 = (ulong)(uint)local_160->max;
                      if (local_160->max < 1) {
                        uVar15 = 0;
                      }
                      lVar21 = 1;
                      pdVar20 = pdVar11;
                      for (uVar9 = 0; uVar15 != uVar9; uVar9 = uVar9 + 1) {
                        if (-1 < local_160->global[uVar9]) {
                          dVar25 = local_c0[lVar21 + -1];
                          dVar24 = local_c8[lVar21 + -1];
                          dVar27 = local_c8[lVar21];
                          dVar2 = (local_c8 + lVar21)[1];
                          dVar3 = local_c0[lVar21];
                          dVar4 = (local_c0 + lVar21)[1];
                          auVar22._0_8_ = dVar4 * dVar27 - dVar2 * dVar3;
                          auVar22._8_8_ = dVar25 * dVar2 - dVar24 * dVar4;
                          *(undefined1 (*) [16])(pdVar20 + -2) = auVar22;
                          *pdVar20 = dVar24 * dVar3 - dVar25 * dVar27;
                        }
                        pdVar20 = pdVar20 + 9;
                        lVar21 = lVar21 + 3;
                      }
                      pdVar11 = pdVar11 + 3;
                    }
                    pRVar10 = prim_dual + 1;
                    uVar9 = 0;
                    uVar15 = (ulong)(uint)local_160->max;
                    if (local_160->max < 1) {
                      uVar15 = uVar9;
                    }
                    for (; uVar15 != uVar9; uVar9 = uVar9 + 1) {
                      if (-1 < local_160->global[uVar9]) {
                        local_140[uVar9] = *pRVar10;
                      }
                      pRVar10 = (REF_DBL *)((long)pRVar10 + local_138);
                    }
                    uVar6 = ref_recon_hessian(local_120,local_140,local_150,local_164);
                    if (uVar6 != 0) {
                      uVar15 = (ulong)uVar6;
                      pcVar19 = "hess_u";
                      uVar16 = 0xafb;
                      goto LAB_001b52de;
                    }
                    local_154 = local_154 & 0xfffffffe;
                    local_d0 = local_e0 / local_a0;
                    uVar6 = 0;
                    pRVar18 = local_160;
                    for (lVar17 = 0; uVar8 = pRVar18->max, lVar17 < (int)uVar8; lVar17 = lVar17 + 1)
                    {
                      if (-1 < pRVar18->global[lVar17]) {
                        lVar21 = lVar17 * local_e8;
                        dVar25 = prim_dual[lVar21 + 1];
                        dVar24 = prim_dual[lVar21 + 2];
                        if (dVar25 <= -dVar25) {
                          dVar25 = -dVar25;
                        }
                        if (dVar24 <= -dVar24) {
                          dVar24 = -dVar24;
                        }
                        dVar27 = prim_dual[lVar21 + 3];
                        if (dVar27 <= -dVar27) {
                          dVar27 = -dVar27;
                        }
                        local_108 = local_110[lVar17 * 5 + 1] * 20.0;
                        local_130 = local_110[lVar17 * 5 + 2];
                        local_148 = (REF_DBL *)local_110[lVar17 * 5 + 3];
                        local_f8 = (double *)
                                   ((dVar27 + dVar27 + dVar25 * 20.0 + dVar24 + dVar24) *
                                   local_110[lVar17 * 5 + 4]);
                        uStack_f0 = 0;
                        local_b8 = *(double *)((long)local_100 + lVar17 * 0x48 + 0x38) -
                                   *(double *)((long)local_100 + lVar17 * 0x48 + 0x28);
                        if (local_b8 <= -local_b8) {
                          local_b8 = -local_b8;
                        }
                        local_b8 = local_b8 * 1.6666666666666667;
                        uStack_b0 = 0;
                        uVar8 = viscosity_law((prim_dual[lVar21 + 4] * 1.4) / prim_dual[lVar21],
                                              local_d8,&mu);
                        if (uVar8 != 0) {
                          uVar15 = (ulong)uVar8;
                          pcVar19 = "sutherlands";
                          uVar16 = 0xb08;
                          goto LAB_001b52de;
                        }
                        if (local_154 == 0xc) {
                          uVar8 = ref_phys_mut_sa(prim_dual[lVar21 + 5],prim_dual[lVar21],
                                                  mu / prim_dual[lVar21],&mu_t);
                          if (uVar8 != 0) {
                            uVar15 = (ulong)uVar8;
                            pcVar19 = "eddy viscosity";
                            uVar16 = 0xb0c;
                            goto LAB_001b52de;
                          }
                          mu = mu_t + mu;
                        }
                        dVar25 = mu * local_d0 *
                                 (local_b8 +
                                 (double)local_f8 +
                                 (double)local_148 + (double)local_148 +
                                 local_130 + local_130 + local_108 + 0.0);
                        if (dVar25 < 0.0) {
                          pcVar19 = "negative weight u1";
                          uVar16 = 0xb10;
                          goto LAB_001b4ee9;
                        }
                        uVar15 = (ulong)(uVar6 & 0x7fffffff);
                        for (lVar21 = 0; lVar21 != 6; lVar21 = lVar21 + 1) {
                          local_128[uVar15 * 2 + lVar21] =
                               local_150[uVar15 * 2 + lVar21] * dVar25 +
                               local_128[uVar15 * 2 + lVar21];
                        }
                        uVar8 = ref_matrix_healthy_m(local_128 + lVar17 * 6);
                        pRVar18 = local_160;
                        if (uVar8 != 0) {
                          uVar15 = (ulong)uVar8;
                          pcVar19 = "u1";
                          uVar16 = 0xb14;
                          goto LAB_001b52de;
                        }
                      }
                      uVar6 = uVar6 + 3;
                    }
                    pRVar10 = prim_dual + 2;
                    uVar9 = 0;
                    uVar15 = (ulong)uVar8;
                    if ((int)uVar8 < 1) {
                      uVar15 = uVar9;
                    }
                    for (; uVar15 != uVar9; uVar9 = uVar9 + 1) {
                      if (-1 < pRVar18->global[uVar9]) {
                        local_140[uVar9] = *pRVar10;
                      }
                      pRVar10 = (REF_DBL *)((long)pRVar10 + local_138);
                    }
                    uVar6 = ref_recon_hessian(local_120,local_140,local_150,local_164);
                    if (uVar6 != 0) {
                      uVar15 = (ulong)uVar6;
                      pcVar19 = "hess_u";
                      uVar16 = 0xb1e;
                      goto LAB_001b52de;
                    }
                    uVar6 = 0;
                    for (lVar17 = 0; uVar8 = local_160->max, lVar17 < (int)uVar8;
                        lVar17 = lVar17 + 1) {
                      if (-1 < local_160->global[lVar17]) {
                        lVar21 = lVar17 * local_e8;
                        dVar25 = prim_dual[lVar21 + 1];
                        dVar24 = prim_dual[lVar21 + 2];
                        if (dVar25 <= -dVar25) {
                          dVar25 = -dVar25;
                        }
                        if (dVar24 <= -dVar24) {
                          dVar24 = -dVar24;
                        }
                        dVar27 = prim_dual[lVar21 + 3];
                        if (dVar27 <= -dVar27) {
                          dVar27 = -dVar27;
                        }
                        local_108 = local_110[lVar17 * 5 + 1];
                        local_148 = (REF_DBL *)local_110[lVar17 * 5 + 3];
                        local_130 = local_110[lVar17 * 5 + 2] * 20.0;
                        local_f8 = (double *)
                                   ((dVar27 + dVar27 + dVar25 + dVar25 + dVar24 * 20.0) *
                                   local_110[lVar17 * 5 + 4]);
                        uStack_f0 = 0;
                        local_b8 = *(double *)((long)local_100 + lVar17 * 0x48 + 0x10) -
                                   *(double *)((long)local_100 + lVar17 * 0x48 + 0x30);
                        if (local_b8 <= -local_b8) {
                          local_b8 = -local_b8;
                        }
                        local_b8 = local_b8 * 1.6666666666666667;
                        uStack_b0 = 0;
                        uVar8 = viscosity_law((prim_dual[lVar21 + 4] * 1.4) / prim_dual[lVar21],
                                              local_d8,&mu);
                        if (uVar8 != 0) {
                          uVar15 = (ulong)uVar8;
                          pcVar19 = "sutherlands";
                          uVar16 = 0xb2b;
                          goto LAB_001b52de;
                        }
                        if (local_154 == 0xc) {
                          uVar8 = ref_phys_mut_sa(prim_dual[lVar21 + 5],prim_dual[lVar21],
                                                  mu / prim_dual[lVar21],&mu_t);
                          if (uVar8 != 0) {
                            uVar15 = (ulong)uVar8;
                            pcVar19 = "eddy viscosity";
                            uVar16 = 0xb2f;
                            goto LAB_001b52de;
                          }
                          mu = mu_t + mu;
                        }
                        dVar25 = mu * local_d0 *
                                 (local_b8 +
                                 (double)local_f8 +
                                 (double)local_148 + (double)local_148 +
                                 local_130 + local_108 + local_108 + 0.0);
                        if (dVar25 < 0.0) {
                          pcVar19 = "negative weight u2";
                          uVar16 = 0xb33;
                          goto LAB_001b4ee9;
                        }
                        uVar15 = (ulong)(uVar6 & 0x7fffffff);
                        for (lVar21 = 0; lVar21 != 6; lVar21 = lVar21 + 1) {
                          local_128[uVar15 * 2 + lVar21] =
                               local_150[uVar15 * 2 + lVar21] * dVar25 +
                               local_128[uVar15 * 2 + lVar21];
                        }
                        uVar8 = ref_matrix_healthy_m(local_128 + lVar17 * 6);
                        if (uVar8 != 0) {
                          uVar15 = (ulong)uVar8;
                          pcVar19 = "u2";
                          uVar16 = 0xb37;
                          goto LAB_001b52de;
                        }
                      }
                      uVar6 = uVar6 + 3;
                    }
                    pRVar10 = prim_dual + 3;
                    uVar9 = 0;
                    uVar15 = (ulong)uVar8;
                    if ((int)uVar8 < 1) {
                      uVar15 = uVar9;
                    }
                    for (; uVar15 != uVar9; uVar9 = uVar9 + 1) {
                      if (-1 < local_160->global[uVar9]) {
                        local_140[uVar9] = *pRVar10;
                      }
                      pRVar10 = (REF_DBL *)((long)pRVar10 + local_138);
                    }
                    uVar6 = ref_recon_hessian(local_120,local_140,local_150,local_164);
                    if (uVar6 != 0) {
                      uVar15 = (ulong)uVar6;
                      pcVar19 = "hess_u";
                      uVar16 = 0xb41;
                      goto LAB_001b52de;
                    }
                    uVar6 = 0;
                    lVar17 = 0;
                    do {
                      uVar8 = local_160->max;
                      if ((int)uVar8 <= lVar17) {
                        uVar9 = 0;
                        uVar15 = (ulong)uVar8;
                        if ((int)uVar8 < 1) {
                          uVar15 = uVar9;
                        }
                        pdVar11 = prim_dual + 4;
                        for (; uVar15 != uVar9; uVar9 = uVar9 + 1) {
                          if (-1 < local_160->global[uVar9]) {
                            local_140[uVar9] = (*pdVar11 * 1.4) / pdVar11[-4];
                          }
                          pdVar11 = (double *)((long)pdVar11 + local_138);
                        }
                        uVar6 = ref_recon_hessian(local_120,local_140,local_150,local_164);
                        if (uVar6 == 0) {
                          local_e0 = (local_e0 * 18.0) / local_a0;
                          uVar6 = 0;
                          lVar17 = 0;
                          do {
                            if (local_160->max <= lVar17) {
                              free(local_100);
                              free(local_c8);
                              free(local_150);
                              free(local_140);
                              free(local_110);
                              free(local_c0);
                              free(local_a8);
                              free(scalar);
                              return 0;
                            }
                            if (-1 < local_160->global[lVar17]) {
                              lVar21 = lVar17 * local_e8;
                              uVar8 = viscosity_law((prim_dual[lVar21 + 4] * 1.4) /
                                                    prim_dual[lVar21],local_d8,&mu);
                              if (uVar8 != 0) {
                                uVar15 = (ulong)uVar8;
                                pcVar19 = "sutherlands";
                                uVar16 = 0xb64;
                                goto LAB_001b52de;
                              }
                              dVar25 = mu / 0.2879999999999999;
                              if (local_154 == 0xc) {
                                uVar8 = ref_phys_mut_sa(prim_dual[lVar21 + 5],prim_dual[lVar21],
                                                        mu / prim_dual[lVar21],&mu_t);
                                if (uVar8 != 0) {
                                  uVar15 = (ulong)uVar8;
                                  pcVar19 = "eddy viscosity";
                                  uVar16 = 0xb69;
                                  goto LAB_001b52de;
                                }
                                auVar26._8_8_ = mu_t;
                                auVar26._0_8_ = mu;
                                auVar22 = divpd(auVar26,_DAT_00206f90);
                                dVar25 = auVar22._8_8_ + auVar22._0_8_;
                                mu = mu + mu_t;
                              }
                              uVar15 = (ulong)(uVar6 & 0x7fffffff);
                              dVar24 = local_110[lVar17 * 5 + 4];
                              for (lVar21 = 0; lVar21 != 6; lVar21 = lVar21 + 1) {
                                local_128[uVar15 * 2 + lVar21] =
                                     local_150[uVar15 * 2 + lVar21] * dVar25 * local_e0 * dVar24 +
                                     local_128[uVar15 * 2 + lVar21];
                              }
                            }
                            lVar17 = lVar17 + 1;
                            uVar6 = uVar6 + 3;
                          } while( true );
                        }
                        uVar15 = (ulong)uVar6;
                        pcVar19 = "hess_u";
                        uVar16 = 0xb61;
                        goto LAB_001b52de;
                      }
                      if (-1 < local_160->global[lVar17]) {
                        lVar21 = lVar17 * local_e8;
                        dVar25 = prim_dual[lVar21 + 1];
                        dVar24 = prim_dual[lVar21 + 2];
                        if (dVar25 <= -dVar25) {
                          dVar25 = -dVar25;
                        }
                        if (dVar24 <= -dVar24) {
                          dVar24 = -dVar24;
                        }
                        dVar27 = prim_dual[lVar21 + 3];
                        if (dVar27 <= -dVar27) {
                          dVar27 = -dVar27;
                        }
                        local_108 = local_110[lVar17 * 5 + 1];
                        local_130 = local_110[lVar17 * 5 + 2];
                        local_148 = (REF_DBL *)(local_110[lVar17 * 5 + 3] * 20.0);
                        local_f8 = (double *)
                                   ((dVar27 * 20.0 + dVar25 + dVar25 + dVar24 + dVar24) *
                                   local_110[lVar17 * 5 + 4]);
                        uStack_f0 = 0;
                        local_b8 = *(double *)((long)local_100 + lVar17 * 0x48 + 0x18) -
                                   *(double *)((long)local_100 + lVar17 * 0x48 + 8);
                        if (local_b8 <= -local_b8) {
                          local_b8 = -local_b8;
                        }
                        local_b8 = local_b8 * 1.6666666666666667;
                        uStack_b0 = 0;
                        uVar8 = viscosity_law((prim_dual[lVar21 + 4] * 1.4) / prim_dual[lVar21],
                                              local_d8,&mu);
                        if (uVar8 != 0) {
                          uVar15 = (ulong)uVar8;
                          pcVar19 = "sutherlands";
                          uVar16 = 0xb4e;
                          goto LAB_001b52de;
                        }
                        if (local_154 == 0xc) {
                          uVar8 = ref_phys_mut_sa(prim_dual[lVar21 + 5],prim_dual[lVar21],
                                                  mu / prim_dual[lVar21],&mu_t);
                          if (uVar8 != 0) {
                            uVar15 = (ulong)uVar8;
                            pcVar19 = "eddy viscosity";
                            uVar16 = 0xb52;
                            goto LAB_001b52de;
                          }
                          mu = mu_t + mu;
                        }
                        dVar25 = mu * local_d0 *
                                 (local_b8 +
                                 (double)local_f8 +
                                 (double)local_148 +
                                 local_130 + local_130 + local_108 + local_108 + 0.0);
                        if (dVar25 < 0.0) {
                          pcVar19 = "negative weight u2";
                          uVar16 = 0xb56;
                          goto LAB_001b4ee9;
                        }
                        uVar15 = (ulong)(uVar6 & 0x7fffffff);
                        for (lVar21 = 0; lVar21 != 6; lVar21 = lVar21 + 1) {
                          local_128[uVar15 * 2 + lVar21] =
                               local_150[uVar15 * 2 + lVar21] * dVar25 +
                               local_128[uVar15 * 2 + lVar21];
                        }
                        uVar8 = ref_matrix_healthy_m(local_128 + lVar17 * 6);
                        if (uVar8 != 0) {
                          uVar15 = (ulong)uVar8;
                          pcVar19 = "u3";
                          uVar16 = 0xb5a;
                          goto LAB_001b52de;
                        }
                      }
                      lVar17 = lVar17 + 1;
                      uVar6 = uVar6 + 3;
                    } while( true );
                  }
                  pcVar19 = "malloc omega of REF_DBL NULL";
                  uVar16 = 0xad3;
                }
              }
            }
          }
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar16
           ,"ref_metric_belme_gu",pcVar19);
    RVar7 = 2;
  }
  return RVar7;
}

Assistant:

REF_FCN REF_STATUS ref_metric_belme_gu(
    REF_DBL *metric, REF_GRID ref_grid, REF_INT ldim, REF_DBL *prim_dual,
    REF_DBL mach, REF_DBL re, REF_DBL reference_temp,
    REF_RECON_RECONSTRUCTION reconstruction) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT var, node, i, dir;
  REF_INT nequ;
  REF_DBL *lam, *hess_lam, *grad_lam, *sr_lam, *u, *hess_u, *grad_u;
  REF_DBL *omega;
  REF_DBL u1, u2, u3;
  REF_DBL w1, w2, w3;
  REF_DBL diag_system[12];
  REF_DBL weight;
  REF_DBL gamma = 1.4;
  REF_DBL t, mu;
  REF_DBL pr = 0.72;
  REF_DBL turbulent_pr = 0.90;
  REF_DBL thermal_conductivity;
  REF_DBL rho, turb, mu_t;

  nequ = ldim / 2;

  ref_malloc_init(lam, ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(hess_lam, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(grad_lam, 3 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(sr_lam, 5 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(u, ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(hess_u, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(grad_u, 3 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(omega, 9 * ref_node_max(ref_node), REF_DBL, 0.0);

  for (var = 0; var < 5; var++) {
    each_ref_node_valid_node(ref_node, node) {
      lam[node] = prim_dual[var + 1 * nequ + ldim * node];
    }
    RSS(ref_recon_hessian(ref_grid, lam, hess_lam, reconstruction), "hess_lam");
    each_ref_node_valid_node(ref_node, node) {
      RSS(ref_matrix_diag_m(&(hess_lam[6 * node]), diag_system), "decomp");
      sr_lam[var + 5 * node] = MAX(MAX(ABS(ref_matrix_eig(diag_system, 0)),
                                       ABS(ref_matrix_eig(diag_system, 1))),
                                   ABS(ref_matrix_eig(diag_system, 2)));
    }
  } /* SR MAX (eig, min(1e-30*max(det^-1/3)) for all lambda of var */

  var = 4;
  each_ref_node_valid_node(ref_node, node) {
    lam[node] = prim_dual[var + 1 * nequ + ldim * node];
  }
  RSS(ref_recon_gradient(ref_grid, lam, grad_lam, reconstruction), "grad_u");

  for (dir = 0; dir < 3; dir++) {
    var = 1 + dir;
    each_ref_node_valid_node(ref_node, node) {
      u[node] = prim_dual[var + 0 * nequ + ldim * node];
    }
    RSS(ref_recon_gradient(ref_grid, u, grad_u, reconstruction), "grad_u");
    each_ref_node_valid_node(ref_node, node) {
      ref_math_cross_product(&(grad_u[3 * node]), &(grad_lam[3 * node]),
                             &(omega[3 * dir + 9 * node]));
    }
  }

  var = 1;
  w1 = 20.0;
  w2 = 2.0;
  w3 = 2.0;
  each_ref_node_valid_node(ref_node, node) {
    u[node] = prim_dual[var + 0 * nequ + ldim * node];
  }
  RSS(ref_recon_hessian(ref_grid, u, hess_u, reconstruction), "hess_u");
  each_ref_node_valid_node(ref_node, node) {
    u1 = ABS(prim_dual[1 + ldim * node]);
    u2 = ABS(prim_dual[2 + ldim * node]);
    u3 = ABS(prim_dual[3 + ldim * node]);
    weight = 0.0;
    weight += w1 * sr_lam[1 + 5 * node];
    weight += w2 * sr_lam[2 + 5 * node];
    weight += w3 * sr_lam[3 + 5 * node];
    weight += (w1 * u1 + w2 * u2 + w3 * u3) * sr_lam[4 + 5 * node];
    weight += (5.0 / 3.0) *
              ABS(omega[1 + 2 * 3 + 9 * node] - omega[2 + 1 * 3 + 9 * node]);
    t = gamma * prim_dual[4 + ldim * node] / prim_dual[0 + ldim * node];
    RSS(viscosity_law(t, reference_temp, &mu), "sutherlands");
    if (6 == nequ) {
      rho = prim_dual[0 + ldim * node];
      turb = prim_dual[5 + ldim * node];
      RSS(ref_phys_mut_sa(turb, rho, mu / rho, &mu_t), "eddy viscosity");
      mu += mu_t;
    }
    weight *= mach / re * mu;
    RAS(weight >= 0.0, "negative weight u1");
    for (i = 0; i < 6; i++) {
      metric[i + 6 * node] += weight * hess_u[i + 6 * node];
    }
    RSS(ref_matrix_healthy_m(&(metric[6 * node])), "u1");
  }

  var = 2;
  w1 = 2.0;
  w2 = 20.0;
  w3 = 2.0;
  each_ref_node_valid_node(ref_node, node) {
    u[node] = prim_dual[var + ldim * node];
  }
  RSS(ref_recon_hessian(ref_grid, u, hess_u, reconstruction), "hess_u");
  each_ref_node_valid_node(ref_node, node) {
    u1 = ABS(prim_dual[1 + ldim * node]);
    u2 = ABS(prim_dual[2 + ldim * node]);
    u3 = ABS(prim_dual[3 + ldim * node]);
    weight = 0.0;
    weight += w1 * sr_lam[1 + 5 * node];
    weight += w2 * sr_lam[2 + 5 * node];
    weight += w3 * sr_lam[3 + 5 * node];
    weight += (w1 * u1 + w2 * u2 + w3 * u3) * sr_lam[4 + 5 * node];
    weight += (5.0 / 3.0) *
              ABS(omega[2 + 0 * 3 + 9 * node] - omega[0 + 2 * 3 + 9 * node]);
    t = gamma * prim_dual[4 + ldim * node] / prim_dual[0 + ldim * node];
    RSS(viscosity_law(t, reference_temp, &mu), "sutherlands");
    if (6 == nequ) {
      rho = prim_dual[0 + ldim * node];
      turb = prim_dual[5 + ldim * node];
      RSS(ref_phys_mut_sa(turb, rho, mu / rho, &mu_t), "eddy viscosity");
      mu += mu_t;
    }
    weight *= mach / re * mu;
    RAS(weight >= 0.0, "negative weight u2");
    for (i = 0; i < 6; i++) {
      metric[i + 6 * node] += weight * hess_u[i + 6 * node];
    }
    RSS(ref_matrix_healthy_m(&(metric[6 * node])), "u2");
  }

  var = 3;
  w1 = 2.0;
  w2 = 2.0;
  w3 = 20.0;
  each_ref_node_valid_node(ref_node, node) {
    u[node] = prim_dual[var + ldim * node];
  }
  RSS(ref_recon_hessian(ref_grid, u, hess_u, reconstruction), "hess_u");
  each_ref_node_valid_node(ref_node, node) {
    u1 = ABS(prim_dual[1 + ldim * node]);
    u2 = ABS(prim_dual[2 + ldim * node]);
    u3 = ABS(prim_dual[3 + ldim * node]);
    weight = 0.0;
    weight += w1 * sr_lam[1 + 5 * node];
    weight += w2 * sr_lam[2 + 5 * node];
    weight += w3 * sr_lam[3 + 5 * node];
    weight += (w1 * u1 + w2 * u2 + w3 * u3) * sr_lam[4 + 5 * node];
    weight += (5.0 / 3.0) *
              ABS(omega[0 + 1 * 3 + 9 * node] - omega[1 + 0 * 3 + 9 * node]);
    t = gamma * prim_dual[4 + ldim * node] / prim_dual[0 + ldim * node];
    RSS(viscosity_law(t, reference_temp, &mu), "sutherlands");
    if (6 == nequ) {
      rho = prim_dual[0 + ldim * node];
      turb = prim_dual[5 + ldim * node];
      RSS(ref_phys_mut_sa(turb, rho, mu / rho, &mu_t), "eddy viscosity");
      mu += mu_t;
    }
    weight *= mach / re * mu;
    RAS(weight >= 0.0, "negative weight u2");
    for (i = 0; i < 6; i++) {
      metric[i + 6 * node] += weight * hess_u[i + 6 * node];
    }
    RSS(ref_matrix_healthy_m(&(metric[6 * node])), "u3");
  }

  each_ref_node_valid_node(ref_node, node) {
    t = gamma * prim_dual[4 + ldim * node] / prim_dual[0 + ldim * node];
    u[node] = t;
  }
  RSS(ref_recon_hessian(ref_grid, u, hess_u, reconstruction), "hess_u");
  each_ref_node_valid_node(ref_node, node) {
    t = gamma * prim_dual[4 + ldim * node] / prim_dual[0 + ldim * node];
    RSS(viscosity_law(t, reference_temp, &mu), "sutherlands");
    thermal_conductivity = mu / (pr * (gamma - 1.0));
    if (6 == nequ) {
      rho = prim_dual[0 + ldim * node];
      turb = prim_dual[5 + ldim * node];
      RSS(ref_phys_mut_sa(turb, rho, mu / rho, &mu_t), "eddy viscosity");
      thermal_conductivity =
          (mu / (pr * (gamma - 1.0)) + mu_t / (turbulent_pr * (gamma - 1.0)));
      mu += mu_t;
    }
    for (i = 0; i < 6; i++) {
      metric[i + 6 * node] += 18.0 * mach / re * thermal_conductivity *
                              sr_lam[4 + 5 * node] * hess_u[i + 6 * node];
    }
  }

  ref_free(omega);
  ref_free(grad_u);
  ref_free(hess_u);
  ref_free(u);
  ref_free(sr_lam);
  ref_free(grad_lam);
  ref_free(hess_lam);
  ref_free(lam);

  return REF_SUCCESS;
}